

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall
ON_BinaryArchive::End3dmTable(ON_BinaryArchive *this,ON_3dmArchiveTableType table,bool bSuccess)

{
  int iVar1;
  ON_3dmArchiveTableType OVar2;
  bool local_17;
  byte local_16;
  bool bReportError;
  bool rc;
  bool bSuccess_local;
  ON_3dmArchiveTableType table_local;
  ON_BinaryArchive *this_local;
  
  if (!bSuccess) {
    Internal_ReportCriticalError(this);
  }
  local_17 = bSuccess;
  iVar1 = ON_SimpleArray<ON_3DM_BIG_CHUNK>::Count(&this->m_chunk);
  if (iVar1 == 0) {
    OVar2 = Active3dmTable(this);
    local_16 = bSuccess;
    if (table != OVar2) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                 ,0x1dbb,"","End3dmTable() table does not match the active table setting.");
      local_16 = 0;
    }
    OVar2 = Previous3dmTable(this);
    if (OVar2 < table) {
      this->m_3dm_previous_table = table;
    }
    else if ((table != user_table) || (OVar2 = Previous3dmTable(this), OVar2 != user_table)) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                 ,0x1dc7,"","3dm archive tables read/written in incorrect order.");
      local_16 = 0;
    }
    if (((local_16 & 1) == 0) && (local_17)) {
      Internal_ReportCriticalError(this);
    }
    if ((this->m_3dm_table_status_list != (ON_3dmTableStatusLink *)0x0) &&
       (this->m_3dm_active_table == (this->m_3dm_table_status_list->m_table_status).m_table_type)) {
      (this->m_3dm_table_status_list->m_table_status).m_state = Finished;
    }
    this->m_3dm_active_table = Unset;
  }
  else {
    if (local_17) {
      Internal_ReportCriticalError(this);
    }
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,0x1dda,"","End3dmTable() called while chunks are open.");
    local_16 = 0;
  }
  if (((local_16 & 1) == 0) && (this->m_3dm_first_failed_table == Unset)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,0x1de0,"","Reading or writing 3dm archive first failure.");
    this->m_3dm_first_failed_table = table;
  }
  return (bool)(local_16 & 1);
}

Assistant:

bool ON_BinaryArchive::End3dmTable(
  ON_3dmArchiveTableType table,
  bool bSuccess
  )
{
  bool rc = bSuccess;

  bool bReportError = true;
  if (false == bSuccess)
  {
    Internal_ReportCriticalError();
    bReportError = false;
  }

  if (0 == m_chunk.Count())
  {
    if (table != Active3dmTable())
    {
      ON_ERROR("End3dmTable() table does not match the active table setting.");
      rc = false;
    }
    if (static_cast<unsigned int>(table) > static_cast<unsigned int>(Previous3dmTable()))
      m_3dm_previous_table = table;
    else
    {
      if (
        ON_3dmArchiveTableType::user_table != table
        || ON_3dmArchiveTableType::user_table != Previous3dmTable()
        )
      {
        ON_ERROR("3dm archive tables read/written in incorrect order.");
        rc = false;
      }
    }
    if (false == rc && bReportError)
    {
      Internal_ReportCriticalError();
      bReportError = false;
    }
    if ( nullptr != m_3dm_table_status_list && m_3dm_active_table == m_3dm_table_status_list->m_table_status.m_table_type )
      m_3dm_table_status_list->m_table_status.m_state = ON_3dmArchiveTableStatus::TableState::Finished;
    m_3dm_active_table = ON_3dmArchiveTableType::Unset;
  }
  else
  {
    if (bReportError)
    {
      Internal_ReportCriticalError();
    }
    ON_ERROR("End3dmTable() called while chunks are open.");
    rc = false;
  }

  if (false == rc && ON_3dmArchiveTableType::Unset == m_3dm_first_failed_table)
  {
    ON_ERROR("Reading or writing 3dm archive first failure.");
    m_3dm_first_failed_table = table;
  }
  return rc;
}